

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMarkowitz(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *m)

{
  type_conflict5 tVar1;
  double local_18;
  
  local_18 = 0.0001;
  tVar1 = boost::multiprecision::operator<(m,&local_18);
  if (tVar1) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)m,0.0001);
  }
  local_18 = 0.9999;
  tVar1 = boost::multiprecision::operator>(m,&local_18);
  if (tVar1) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)m,0.9999);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->minThreshold).m_backend,&m->m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->lastThreshold).m_backend,&m->m_backend);
  return;
}

Assistant:

void setMarkowitz(R m)
   {
      if(m < 0.0001)
         m = 0.0001;

      if(m > 0.9999)
         m = 0.9999;

      minThreshold = m;
      lastThreshold = m;
   }